

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O1

BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> * __thiscall
gmlc::containers::
DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::find
          (BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> *__return_storage_ptr__,
          DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
          *this,GlobalFederateId *searchValue)

{
  __node_base_ptr p_Var1;
  FedInfo **ppFVar2;
  int iVar3;
  uint uVar4;
  FedInfo *pFVar5;
  _Hash_node_base *p_Var6;
  
  p_Var6 = (_Hash_node_base *)0x0;
  p_Var1 = std::
           _Hashtable<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalFederateId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     (&(this->lookup2)._M_h,
                      (ulong)(long)searchValue->gid % (this->lookup2)._M_h._M_bucket_count,
                      searchValue,(long)searchValue->gid);
  if (p_Var1 != (__node_base_ptr)0x0) {
    p_Var6 = p_Var1->_M_nxt;
  }
  if (p_Var6 == (_Hash_node_base *)0x0) {
    StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end
              (__return_storage_ptr__,&this->dataStorage);
    return __return_storage_ptr__;
  }
  if ((this->dataStorage).csize == 0) {
    iVar3 = (this->dataStorage).bsize;
    ppFVar2 = (this->dataStorage).dataptr;
    if ((long)iVar3 != 0x20) {
      ppFVar2 = ppFVar2 + (this->dataStorage).dataSlotIndex;
      pFVar5 = *ppFVar2 + iVar3;
      goto LAB_0031dab3;
    }
    if (ppFVar2 == (FedInfo **)0x0) {
      ppFVar2 = &StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end::
                 emptyValue;
    }
    else {
      ppFVar2 = ppFVar2 + (long)(this->dataStorage).dataSlotIndex + 1;
    }
  }
  else {
    ppFVar2 = (this->dataStorage).dataptr;
  }
  pFVar5 = *ppFVar2;
  iVar3 = 0;
LAB_0031dab3:
  p_Var6 = p_Var6[2]._M_nxt;
  __return_storage_ptr__->vec = ppFVar2;
  __return_storage_ptr__->ptr = pFVar5 + (long)p_Var6;
  uVar4 = (int)p_Var6 + iVar3;
  __return_storage_ptr__->offset = uVar4;
  if (0x1f < (int)uVar4) {
    __return_storage_ptr__->vec = ppFVar2 + (ulong)(uVar4 - 0x20 >> 5) + 1;
    __return_storage_ptr__->offset = uVar4 & 0x1f;
    __return_storage_ptr__->ptr =
         (FedInfo *)
         ((long)&ppFVar2[(ulong)(uVar4 - 0x20 >> 5) + 1]->fed + (ulong)((uVar4 & 0x1f) << 4));
  }
  return __return_storage_ptr__;
}

Assistant:

auto find(const searchType2& searchValue)
        {
            auto fnd = lookup2.find(searchValue);
            if (fnd != lookup2.end()) {
                return dataStorage.begin() + fnd->second;
            }
            return dataStorage.end();
        }